

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::HandleSharedDependency(cmComputeLinkDepends *this,SharedDepEntry *dep)

{
  pointer ppVar1;
  string *psVar2;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_00;
  cmLinkInterface *iface_00;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>,_bool> pVar3;
  cmLinkInterface *iface;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  bool local_c2;
  bool local_c1;
  reference local_c0;
  LinkEntry *entry;
  cmListFileBacktrace local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_78;
  reference local_48;
  LinkEntry *entry_1;
  size_t index;
  undefined1 local_30;
  _Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_> local_28;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>,_bool> lei;
  SharedDepEntry *dep_local;
  cmComputeLinkDepends *this_local;
  
  lei._8_8_ = dep;
  pVar3 = AllocateLinkEntry(this,&dep->Item);
  index = (size_t)pVar3.first._M_node;
  local_30 = pVar3.second;
  local_28._M_node = (_Base_ptr)index;
  lei.first._M_node._0_1_ = local_30;
  ppVar1 = std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_unsigned_long>_>::operator->
                     (&local_28);
  entry_1 = (LinkEntry *)ppVar1->second;
  if (((byte)lei.first._M_node & 1) != 0) {
    local_48 = std::
               vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
               ::operator[](&this->EntryList,(size_type)entry_1);
    psVar2 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)lei._8_8_);
    std::__cxx11::string::string((string *)&local_98,(string *)psVar2);
    cmListFileBacktrace::cmListFileBacktrace(&local_a8,(cmListFileBacktrace *)(lei._8_8_ + 0x58));
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
              (&local_78,&local_98,&local_a8);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::operator=
              (&local_48->Item,&local_78);
    BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
              (&local_78);
    cmListFileBacktrace::~cmListFileBacktrace(&local_a8);
    std::__cxx11::string::~string((string *)&local_98);
    local_48->Target = *(cmGeneratorTarget **)(lei._8_8_ + 0x20);
    local_48->Kind = SharedDep;
  }
  local_c0 = std::
             vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ::operator[](&this->EntryList,(size_type)entry_1);
  this_00 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
            std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                      (&(this->EntryConstraintGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                       *(size_type *)(lei._8_8_ + 0x68));
  local_c1 = true;
  local_c2 = false;
  iface = (cmLinkInterface *)0x0;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&iface);
  std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
  emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace>
            (this_00,(unsigned_long *)&entry_1,&local_c1,&local_c2,(cmListFileBacktrace *)&iface);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&iface);
  if ((local_c0->Target != (cmGeneratorTarget *)0x0) &&
     (iface_00 = cmGeneratorTarget::GetLinkInterface(local_c0->Target,&this->Config,this->Target),
     iface_00 != (cmLinkInterface *)0x0)) {
    FollowSharedDeps(this,(size_t)entry_1,iface_00,true);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::HandleSharedDependency(SharedDepEntry const& dep)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(dep.Item);
  size_t index = lei.first->second;

  // Check if the target does not already has an entry.
  if (lei.second) {
    // Initialize the item entry.
    LinkEntry& entry = this->EntryList[index];
    entry.Item = BT<std::string>(dep.Item.AsStr(), dep.Item.Backtrace);
    entry.Target = dep.Item.Target;

    // This item was added specifically because it is a dependent
    // shared library.  It may get special treatment
    // in cmComputeLinkInformation.
    entry.Kind = LinkEntry::SharedDep;
  }

  // Get the link entry for this target.
  LinkEntry& entry = this->EntryList[index];

  // This shared library dependency must follow the item that listed
  // it.
  this->EntryConstraintGraph[dep.DependerIndex].emplace_back(
    index, true, false, cmListFileBacktrace());

  // Target items may have their own dependencies.
  if (entry.Target) {
    if (cmLinkInterface const* iface =
          entry.Target->GetLinkInterface(this->Config, this->Target)) {
      // Follow public and private dependencies transitively.
      this->FollowSharedDeps(index, iface, true);
    }
  }
}